

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

rk_s32 kmpp_obj_ioctl(KmppObj obj,rk_s32 cmd,KmppObj in,KmppObj out,char *caller)

{
  anon_union_8_2_e6ce6506_for_KmppShmPtr_t_2 aVar1;
  KmppObjDefImpl *pKVar2;
  undefined8 in_stack_ffffffffffffff68;
  MppTrie pvVar3;
  undefined4 local_88;
  undefined4 local_84;
  anon_union_8_2_f7e366f2_for_KmppShmPtr_t_0 local_80;
  anon_union_8_2_e6ce6506_for_KmppShmPtr_t_2 local_78;
  rk_u32 rStack_70;
  undefined4 uStack_6c;
  KmppShmPtr *local_68;
  KmppObjImpl *impl_out;
  KmppObjImpl *impl_in;
  rk_s32 fd;
  rk_s32 ret;
  KmppObjImpl *impl;
  KmppObjImpl *ioc;
  KmppObjIocArg *ioc_arg;
  char *caller_local;
  KmppObj out_local;
  KmppObj in_local;
  KmppObj pvStack_18;
  rk_s32 cmd_local;
  KmppObj obj_local;
  undefined4 uVar4;
  
  pvVar3 = (MppTrie)local_78;
  pKVar2 = (KmppObjDefImpl *)local_80;
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  impl = (KmppObjImpl *)0x0;
  rStack_70 = 0x1804ff;
  uStack_6c = 0;
  _fd = obj;
  ioc_arg = (KmppObjIocArg *)caller;
  caller_local = (char *)out;
  out_local = in;
  in_local._4_4_ = cmd;
  pvStack_18 = obj;
  impl_in._4_4_ = kmpp_obj_get_by_name(&impl,"KmppIoc",caller);
  if (impl_in._4_4_ == 0) {
    rStack_70 = 0x180549;
    uStack_6c = 0;
    impl_in._0_4_ = open("/dev/kmpp_ioctl",2);
    if ((int)(uint)impl_in < 0) {
      rStack_70 = 0x180574;
      uStack_6c = 0;
      _mpp_log_l(2,"kmpp_obj","failed to open /dev/kmpp_ioctl ret %d\n",(char *)0x0,
                 (ulong)(uint)impl_in);
      obj_local._4_4_ = -1;
    }
    else {
      ioc = (KmppObjImpl *)&stack0xffffffffffffff78;
      local_88 = 1;
      local_84 = 0;
      local_80 = impl->shm->field_0;
      aVar1 = impl->shm->field_1;
      if ((kmpp_obj_debug & 0x10) != 0) {
        local_78 = aVar1;
        _mpp_log_l(4,"kmpp_obj","ioctl arg %p obj_sptr [u:k] %llx : %llx\n",(char *)0x0,ioc,pKVar2,
                   pvVar3);
        uVar4 = (undefined4)((ulong)pvVar3 >> 0x20);
        aVar1 = local_78;
      }
      local_78 = aVar1;
      if ((kmpp_obj_debug & 0x10) != 0) {
        _mpp_log_l(4,"kmpp_obj","ioctl def %s - %d cmd %d\n",(char *)0x0,
                   *(undefined8 *)(*(long *)((long)_fd + 8) + 0x18),
                   (ulong)*(uint *)(*(long *)((long)_fd + 8) + 8),CONCAT44(uVar4,in_local._4_4_));
      }
      kmpp_obj_set_u32(impl,"def",*(rk_u32 *)(*(long *)((long)_fd + 8) + 8));
      kmpp_obj_set_u32(impl,"cmd",in_local._4_4_);
      kmpp_obj_set_u32(impl,"flag",0);
      kmpp_obj_set_u32(impl,"id",0);
      if (out_local != (KmppObj)0x0) {
        impl_out = (KmppObjImpl *)out_local;
        kmpp_obj_set_shm(impl,"in",*(KmppShmPtr **)((long)out_local + 0x20));
        if ((kmpp_obj_debug & 0x10) != 0) {
          _mpp_log_l(4,"kmpp_obj","ioctl [u:k] in %#llx : %#llx\n",(char *)0x0,
                     (impl_out->shm->field_0).uaddr,(impl_out->shm->field_1).kaddr);
        }
      }
      if (caller_local != (char *)0x0) {
        local_68 = (KmppShmPtr *)caller_local;
        kmpp_obj_set_shm(impl,"out",*(KmppShmPtr **)(caller_local + 0x20));
        if ((kmpp_obj_debug & 0x10) != 0) {
          _mpp_log_l(4,"kmpp_obj","ioctl [u:k] in %#llx : %#llx\n",(char *)0x0,
                     *local_68[2].field_0.uptr,*(undefined8 *)(local_68[2].field_0.uaddr + 8));
        }
      }
      impl_in._4_4_ = ioctl((uint)impl_in,0,ioc);
      kmpp_obj_put(impl,(char *)ioc_arg);
      close((uint)impl_in);
      obj_local._4_4_ = impl_in._4_4_;
    }
  }
  else {
    rStack_70 = 0x18052a;
    uStack_6c = 0;
    _mpp_log_l(2,"kmpp_obj","failed to get KmppIoc ret %d\n",(char *)0x0,(ulong)impl_in._4_4_);
    obj_local._4_4_ = -1;
  }
  return obj_local._4_4_;
}

Assistant:

rk_s32 kmpp_obj_ioctl(KmppObj obj, rk_s32 cmd, KmppObj in, KmppObj out, const char *caller)
{
    KmppObjIocArg *ioc_arg;
    KmppObjImpl *ioc = NULL;
    KmppObjImpl *impl = (KmppObjImpl *)obj;
    rk_s32 ret;
    rk_s32 fd;

    ret = kmpp_obj_get_by_name((KmppObj *)&ioc, "KmppIoc", caller);
    if (ret) {
        mpp_loge("failed to get KmppIoc ret %d\n", ret);
        return rk_nok;
    }

    fd = open("/dev/kmpp_ioctl", O_RDWR);
    if (fd < 0) {
        mpp_loge("failed to open /dev/kmpp_ioctl ret %d\n", fd);
        return rk_nok;
    }

    ioc_arg = alloca(sizeof(KmppObjIocArg) + sizeof(KmppShmPtr));
    ioc_arg->count = 1;
    ioc_arg->flag = 0;
    ioc_arg->obj_sptr[0].uaddr = ioc->shm->uaddr;
    ioc_arg->obj_sptr[0].kaddr = ioc->shm->kaddr;

    obj_dbg_ioctl("ioctl arg %p obj_sptr [u:k] %llx : %llx\n", ioc_arg,
                  ioc_arg->obj_sptr[0].uaddr, ioc_arg->obj_sptr[0].kaddr);

    obj_dbg_ioctl("ioctl def %s - %d cmd %d\n", impl->def->name, impl->def->index, cmd);

    kmpp_obj_set_u32(ioc, "def", impl->def->index);
    kmpp_obj_set_u32(ioc, "cmd", cmd);
    kmpp_obj_set_u32(ioc, "flag", 0);
    kmpp_obj_set_u32(ioc, "id", 0);

    if (in) {
        KmppObjImpl *impl_in = (KmppObjImpl *)in;

        kmpp_obj_set_shm(ioc, "in", impl_in->shm);
        obj_dbg_ioctl("ioctl [u:k] in %#llx : %#llx\n",
                      impl_in->shm->uaddr, impl_in->shm->kaddr);
    }
    if (out) {
        KmppObjImpl *impl_out = (KmppObjImpl *)out;

        kmpp_obj_set_shm(ioc, "out", impl_out->shm);
        obj_dbg_ioctl("ioctl [u:k] in %#llx : %#llx\n",
                      impl_out->shm->uaddr, impl_out->shm->kaddr);
    }

    ret = ioctl(fd, 0, ioc_arg);

    kmpp_obj_put(ioc, caller);

    close(fd);

    return ret;
}